

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O0

void apply_complex_filter(equippable_filter *f,equippable_summary *s)

{
  _Bool _Var1;
  byte *p;
  byte local_3a;
  byte local_39;
  wchar_t local_2c;
  wchar_t local_28;
  wchar_t j;
  wchar_t i;
  wchar_t nst;
  _Bool *stack;
  equippable_summary *s_local;
  equippable_filter *f_local;
  
  if (f->nv < L'\x01') {
    __assert_fail("f->nv > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                  ,0x6eb,
                  "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                 );
  }
  p = (byte *)mem_alloc((long)f->nv);
  j = L'\0';
  s->nfilt = L'\0';
  local_28 = L'\0';
  do {
    if (s->nitems <= local_28) {
      s->sorted_indices[s->nfilt] = -1;
      mem_free(p);
      return;
    }
    local_2c = L'\0';
    while( true ) {
      if (f->nv < local_2c) {
        __assert_fail("j <= f->nv",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                      ,0x6f3,
                      "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                     );
      }
      if (f->v[local_2c].c == EQUIP_EXPR_TERMINATOR) break;
      switch(f->v[local_2c].c) {
      case EQUIP_EXPR_SELECTOR:
        if (f->nv <= j) {
          __assert_fail("nst < f->nv",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                        ,0x702,
                        "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                       );
        }
        _Var1 = (*f->v[local_2c].s.func)(s->items + local_28,&f->v[local_2c].s.ex);
        p[j] = _Var1;
        j = j + L'\x01';
        break;
      case EQUIP_EXPR_AND:
        if (j < L'\x02') {
          __assert_fail("nst >= 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                        ,0x709,
                        "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                       );
        }
        local_39 = 0;
        if ((p[j + L'\xffffffff'] & 1) != 0) {
          local_39 = p[j + L'\xfffffffe'];
        }
        p[j + L'\xfffffffe'] = local_39 & 1;
        j = j + L'\xffffffff';
        break;
      case EQUIP_EXPR_OR:
        if (j < L'\x02') {
          __assert_fail("nst >= 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                        ,0x710,
                        "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                       );
        }
        local_3a = 1;
        if ((p[j + L'\xffffffff'] & 1) == 0) {
          local_3a = p[j + L'\xfffffffe'];
        }
        p[j + L'\xfffffffe'] = local_3a & 1;
        j = j + L'\xffffffff';
        break;
      case EQUIP_EXPR_TERMINATOR:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                      ,0x717,
                      "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                     );
      }
      local_2c = local_2c + L'\x01';
    }
    if (j != L'\x01') {
      __assert_fail("nst == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                    ,0x6f6,
                    "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                   );
    }
    if ((*p & 1) != 0) {
      if ((s->nitems <= s->nfilt) || (s->nalloc <= s->nfilt)) {
        __assert_fail("s->nfilt < s->nitems && s->nfilt < s->nalloc",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                      ,0x6f9,
                      "void apply_complex_filter(const struct equippable_filter *, struct equippable_summary *)"
                     );
      }
      s->sorted_indices[s->nfilt] = local_28;
      s->nfilt = s->nfilt + L'\x01';
    }
    local_28 = local_28 + L'\x01';
  } while( true );
}

Assistant:

static void apply_complex_filter(const struct equippable_filter *f,
	struct equippable_summary *s)
{
	bool *stack;
	int nst, i;

	assert(f->nv > 0);
	stack = mem_alloc(f->nv * sizeof(*stack));
	nst = 0;
	s->nfilt = 0;
	for (i = 0; i < s->nitems; ++i) {
		int j = 0;

		while (1) {
			assert(j <= f->nv);

			if (f->v[j].c == EQUIP_EXPR_TERMINATOR) {
				assert(nst == 1);
				if (stack[0]) {
					assert(s->nfilt < s->nitems &&
						s->nfilt < s->nalloc);
					s->sorted_indices[s->nfilt] = i;
					++s->nfilt;
				}
				break;
			}

			switch (f->v[j].c) {
			case EQUIP_EXPR_SELECTOR:
				assert(nst < f->nv);
				stack[nst] = (*f->v[j].s.func)(s->items + i,
					&f->v[j].s.ex);
				++nst;
				break;

			case EQUIP_EXPR_AND:
				assert(nst >= 2);
				stack[nst - 2] =
					(stack[nst - 1] && stack[nst - 2]);
				--nst;
				break;

			case EQUIP_EXPR_OR:
				assert(nst >= 2);
				stack[nst - 2] =
					(stack[nst - 1] || stack[nst - 2]);
				--nst;
				break;

			case EQUIP_EXPR_TERMINATOR:
				assert(0);
			}
			++j;
		}
	}

	s->sorted_indices[s->nfilt] = -1;

	mem_free(stack);
}